

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  code *pRtree_00;
  RtreeNode *pRVar1;
  int in_ECX;
  RtreeNode *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  RtreeNode *p;
  RtreeNode *pChild;
  _func_int_Rtree_ptr_sqlite3_int64_sqlite3_int64 *xSetMapping;
  RtreeNode *in_stack_ffffffffffffffb8;
  RtreeNode *pRVar2;
  i64 in_stack_ffffffffffffffc8;
  int local_4;
  
  pRtree_00 = parentWrite;
  if (in_ECX == 0) {
    pRtree_00 = rowidWrite;
  }
  if (0 < in_ECX) {
    pRVar1 = nodeHashLookup((Rtree *)pRtree_00,in_stack_ffffffffffffffc8);
    for (pRVar2 = in_RDX; pRVar2 != (RtreeNode *)0x0; pRVar2 = pRVar2->pParent) {
      if (pRVar2 == pRVar1) {
        return 0x10b;
      }
    }
    if (pRVar1 != (RtreeNode *)0x0) {
      nodeRelease((Rtree *)0x0,in_stack_ffffffffffffffb8);
      nodeReference(in_RDX);
      pRVar1->pParent = in_RDX;
    }
  }
  if (in_RDX == (RtreeNode *)0x0) {
    local_4 = 1;
  }
  else {
    local_4 = (*pRtree_00)(in_RDI,in_RSI,in_RDX->iNode);
  }
  return local_4;
}

Assistant:

static int updateMapping(
  Rtree *pRtree,
  i64 iRowid,
  RtreeNode *pNode,
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    RtreeNode *p;
    for(p=pNode; p; p=p->pParent){
      if( p==pChild ) return SQLITE_CORRUPT_VTAB;
    }
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( NEVER(pNode==0) ) return SQLITE_ERROR;
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}